

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

Var Js::JavascriptMath::Exponentiation_Full(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  Var pvVar1;
  double dVar2;
  double y_00;
  double y;
  double x;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  Var aLeft_local;
  
  dVar2 = JavascriptConversion::ToNumber(aLeft,scriptContext);
  y_00 = JavascriptConversion::ToNumber(aRight,scriptContext);
  dVar2 = Math::Pow(dVar2,y_00);
  pvVar1 = JavascriptNumber::ToVarIntCheck(dVar2,scriptContext);
  return pvVar1;
}

Assistant:

Var JavascriptMath::Exponentiation_Full(Var aLeft, Var aRight, ScriptContext *scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Exponentiation_Full);
            double x = JavascriptConversion::ToNumber(aLeft, scriptContext);
            double y = JavascriptConversion::ToNumber(aRight, scriptContext);
            return JavascriptNumber::ToVarIntCheck(Math::Pow(x, y), scriptContext);
            JIT_HELPER_END(Op_Exponentiation_Full);
        }